

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::FindPackageStackRAII::FindPackageStackRAII
          (FindPackageStackRAII *this,cmMakefile *mf,string *name)

{
  uint *puVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> local_58;
  long *local_48 [2];
  long local_38 [2];
  uint local_28;
  
  this->Makefile = mf;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + name->_M_string_length);
  local_28 = this->Makefile->FindPackageStackNextIndex;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Push
            (&local_58,(cmFindPackageCall *)&mf->FindPackageStack);
  _Var5._M_pi = local_58.TopEntry.
                super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar4 = local_58.TopEntry.
           super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pcVar3 = this->Makefile;
  local_58.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pcVar3->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (pcVar3->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar4;
  (pcVar3->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var5._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (local_58.TopEntry.
        super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  puVar1 = &this->Makefile->FindPackageStackNextIndex;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

cmMakefile::FindPackageStackRAII::FindPackageStackRAII(cmMakefile* mf,
                                                       std::string const& name)
  : Makefile(mf)
{
  this->Makefile->FindPackageStack =
    this->Makefile->FindPackageStack.Push(cmFindPackageCall{
      name,
      this->Makefile->FindPackageStackNextIndex,
    });
  this->Makefile->FindPackageStackNextIndex++;
}